

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinput.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  ostream *poVar2;
  long *plVar3;
  Am_Style aAStack_48 [8];
  Am_Style local_40 [12];
  Am_Input_Char local_34;
  my_input_handlers handlers;
  
  handlers.super_Am_Input_Event_Handlers._vptr_Am_Input_Event_Handlers =
       (Am_Input_Event_Handlers)&PTR_Iconify_Notify_00105ce0;
  Am_Input_Char::Am_Input_Char(&local_34,"Q",true);
  Am_Input_Char::operator=(&test_ic,&local_34);
  puVar1 = (undefined8 *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Size of Am_Input_Char is ",0x19);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  _Am_Debug_Print_Input_Events = 1;
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  d = (Am_Drawonable *)
      (**(code **)*puVar1)
                (puVar1,800,0,500,200,"testinput","testinput icon",1,0,local_40,0,1,1,0,0,1,0,0,0,
                 &handlers);
  Am_Style::~Am_Style(local_40);
  Am_Style::Am_Style(aAStack_48,(Am_Style *)&Am_No_Style);
  d2 = (Am_Drawonable *)
       (**(code **)*puVar1)
                 (puVar1,800,300,500,200,"testinput2","testinput2 icon",1,0,aAStack_48,0,1,1,0,0,1,0
                  ,0,0,&handlers);
  Am_Style::~Am_Style(aAStack_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"window 1 = ",0xb);
  plVar3 = (long *)operator<<((ostream *)&std::cout,d);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"window 2 = ",0xb);
  plVar3 = (long *)operator<<((ostream *)&std::cout,d2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  (**(code **)(*(long *)d + 0xa0))();
  (**(code **)(*(long *)d2 + 0xa0))();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"******  Now type keys into window.\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"^M want mouse move, ^m don\'t want mouse move.\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"^E want enter leave, ^e don\'t want enter leave.\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"^W want multiple windows, ^w don\'t want multiple windows.\n",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"^t to change test input string.\n",0x20);
  Am_Drawonable::Main_Loop();
  return 0;
}

Assistant:

int
main()
{

  my_input_handlers handlers;

  test_ic = Am_Input_Char("Q");

  Am_Drawonable *root = Am_Drawonable::Get_Root_Drawonable();

  cout << "Size of Am_Input_Char is " << sizeof(test_ic) << endl;

  Am_Debug_Print_Input_Events = 1;

  d = root->Create(TESTINPUT_D_LEFT, TESTINPUT_D_TOP, 500, 200, "testinput",
                   "testinput icon", true, false, Am_No_Style, false, 1, 1, 0,
                   0, true, false, false, false, &handlers);

  d2 = root->Create(TESTINPUT_D2_LEFT, TESTINPUT_D2_TOP, 500, 200, "testinput2",
                    "testinput2 icon", true, false, Am_No_Style, false, 1, 1, 0,
                    0, true, false, false, false, &handlers);

  cout << "window 1 = " << d << endl;
  cout << "window 2 = " << d2 << endl;

  d->Flush_Output();
  d2->Flush_Output();

  cout << "******  Now type keys into window.\n";
  cout << "^M want mouse move, ^m don't want mouse move.\n";
  cout << "^E want enter leave, ^e don't want enter leave.\n";
  cout << "^W want multiple windows, ^w don't want multiple windows.\n";
  cout << "^t to change test input string.\n";

  Am_Drawonable::Main_Loop();

  return 0;
}